

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection-visitor.hpp
# Opt level: O2

void miyuki::refl::
     accept<miyuki::serialize::AutoLoadVisitor,24ul,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
               (AutoLoadVisitor visitor,char (*args_s) [24],int *args,int *args_1,int *args_2,
               shared_ptr<Bar> *args_3,shared_ptr<Bar> *args_4,
               vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *args_5)

{
  _Alloc_hider _Var1;
  int iVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_type sVar6;
  ulong uVar7;
  undefined1 local_178 [8];
  AutoLoadVisitor local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  shared_ptr<Bar> *local_150;
  string s;
  char *a [6];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL> array;
  
  local_170.ar = visitor.ar;
  local_168 = args;
  local_160 = args_1;
  local_158 = args_2;
  local_150 = args_3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,*args_s,(allocator<char> *)&array)
  ;
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
  array(&array);
  uVar5 = 0;
  lVar3 = 0;
  do {
    _Var1._M_p = s._M_dataplus._M_p;
    if (lVar3 == 6) {
      for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 8) {
        *(undefined8 *)((long)a + lVar3) =
             *(undefined8 *)((long)&array._M_elems[0]._M_dataplus._M_p + lVar3 * 4);
      }
      accept<miyuki::serialize::AutoLoadVisitor,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
                (local_170,a,local_168,local_160,local_158,local_150,args_4,args_5);
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>::
      ~array(&array);
      std::__cxx11::string::~string((string *)&s);
      return;
    }
    sVar6 = s._M_string_length;
    if (s._M_string_length < uVar5) {
      sVar6 = uVar5;
    }
    while ((uVar7 = sVar6, sVar6 != uVar5 &&
           (iVar2 = isspace((int)_Var1._M_p[uVar5]), uVar7 = uVar5, iVar2 != 0))) {
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar7;
    for (; (sVar6 = s._M_string_length, _Var1._M_p = s._M_dataplus._M_p, uVar4 = uVar4 + 1,
           uVar7 < s._M_string_length && (s._M_dataplus._M_p[uVar7] != ',')); uVar7 = uVar7 + 1) {
      std::__cxx11::string::push_back((char)local_178 + (char)lVar3 * ' ' + -0x78);
    }
    do {
      uVar5 = uVar4;
      if (sVar6 <= uVar5) break;
      iVar2 = isspace((int)_Var1._M_p[uVar5]);
      uVar4 = uVar5 + 1;
    } while (iVar2 != 0);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void accept(Visitor visitor, const char (&args_s)[N], Args &... args) {
        std::string s = args_s;
        std::array<std::string, sizeof...(Args)> array;
        size_t pos = 0;
        for (size_t i = 0; i < array.size(); i++) {
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
            while (pos < s.length() && s[pos] != ',')
                array[i] += s[pos++];
            pos++;
            while (pos < s.length() && isspace(s[pos])) {
                pos++;
            }
        }
        const char *a[sizeof...(Args)];
        for (size_t i = 0; i < array.size(); i++) {
            a[i] = array[i].c_str();
        }
        accept<Visitor, Args...>(visitor, a, args...);
    }